

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O3

void __thiscall Reducer::reduceUsingPasses(Reducer *this)

{
  pointer pcVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  bool bVar4;
  long *plVar5;
  ostream *poVar6;
  ulong uVar7;
  long *extraout_RAX;
  size_type *psVar8;
  long *plVar9;
  long lVar10;
  undefined1 auVar11 [8];
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  undefined1 local_640 [24];
  undefined1 auStack_628 [24];
  undefined1 local_610 [16];
  undefined1 *local_600 [2];
  undefined1 local_5f0 [16];
  undefined1 *local_5e0 [2];
  undefined1 local_5d0 [16];
  undefined1 *local_5c0 [2];
  undefined1 local_5b0 [16];
  undefined1 *local_5a0 [2];
  undefined1 local_590 [16];
  undefined1 *local_580 [2];
  undefined1 local_570 [16];
  undefined1 *local_560 [2];
  undefined1 local_550 [16];
  undefined1 *local_540 [2];
  undefined1 local_530 [16];
  undefined1 *local_520 [2];
  undefined1 local_510 [16];
  undefined1 *local_500 [2];
  undefined1 local_4f0 [16];
  undefined1 *local_4e0 [2];
  undefined1 local_4d0 [16];
  undefined1 *local_4c0 [2];
  undefined1 local_4b0 [16];
  undefined1 *local_4a0 [2];
  undefined1 local_490 [16];
  undefined1 *local_480 [2];
  undefined1 local_470 [16];
  undefined1 *local_460 [2];
  undefined1 local_450 [16];
  undefined1 *local_440 [2];
  undefined1 local_430 [16];
  undefined1 *local_420 [2];
  undefined1 local_410 [16];
  undefined1 *local_400 [2];
  undefined1 local_3f0 [16];
  undefined1 *local_3e0 [2];
  undefined1 local_3d0 [16];
  undefined1 *local_3c0 [2];
  undefined1 local_3b0 [16];
  undefined1 *local_3a0 [2];
  undefined1 local_390 [16];
  undefined1 *local_380 [2];
  undefined1 local_370 [16];
  undefined1 *local_360 [2];
  undefined1 local_350 [16];
  undefined1 *local_340 [2];
  undefined1 local_330 [16];
  undefined1 *local_320 [2];
  undefined1 local_310 [16];
  undefined1 *local_300 [2];
  undefined1 local_2f0 [16];
  undefined1 *local_2e0 [2];
  undefined1 local_2d0 [16];
  undefined1 *local_2c0 [2];
  undefined1 local_2b0 [16];
  undefined1 *local_2a0 [2];
  undefined1 local_290 [16];
  undefined1 *local_280 [2];
  undefined1 local_270 [16];
  undefined1 *local_260 [2];
  undefined1 local_250 [16];
  undefined1 *local_240 [2];
  undefined1 local_230 [16];
  long *local_220 [2];
  long local_210 [2];
  undefined1 local_200 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  passes;
  undefined1 local_1d8 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  string local_1a0;
  long *local_180 [2];
  long local_170 [2];
  long *local_160 [2];
  long local_150 [2];
  long *local_140 [2];
  long local_130 [2];
  size_type *local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> pass;
  long local_f0;
  long lStack_e8;
  long *local_e0;
  long local_d8;
  long local_d0;
  long lStack_c8;
  long *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  size_type *local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  size_type *local_78;
  string currCommand;
  long local_48;
  long lStack_40;
  uint local_34;
  
  local_640._0_8_ = local_640 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_640,"-Oz","");
  auStack_628._8_8_ = local_610;
  std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_628 + 8),"-Os","");
  local_600[0] = local_5f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_600,"-O1","");
  local_5e0[0] = local_5d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5e0,"-O2","");
  local_5c0[0] = local_5b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5c0,"-O3","");
  local_5a0[0] = local_590;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5a0,"-O4","");
  local_580[0] = local_570;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_580,"--flatten -Os","");
  local_560[0] = local_550;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_560,"--flatten -O3","");
  local_540[0] = local_530;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_540,"--flatten --simplify-locals-notee-nostructure --local-cse -Os","")
  ;
  local_520[0] = local_510;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_520,"--coalesce-locals --vacuum","");
  local_500[0] = local_4f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_500,"--dae","");
  local_4e0[0] = local_4d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4e0,"--dae-optimizing","");
  local_4c0[0] = local_4b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4c0,"--dce","");
  local_4a0[0] = local_490;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4a0,"--duplicate-function-elimination","");
  local_480[0] = local_470;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_480,"--gto","");
  local_460[0] = local_450;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_460,"--inlining","");
  local_440[0] = local_430;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_440,"--inlining-optimizing","");
  local_420[0] = local_410;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_420,"--optimize-level=3 --inlining-optimizing","");
  local_400[0] = local_3f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_400,"--local-cse","");
  local_3e0[0] = local_3d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3e0,"--memory-packing","");
  local_3c0[0] = local_3b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3c0,"--remove-unused-names --merge-blocks --vacuum","");
  local_3a0[0] = local_390;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3a0,"--optimize-instructions","");
  local_380[0] = local_370;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_380,"--precompute","");
  local_360[0] = local_350;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_360,"--remove-imports","");
  local_340[0] = local_330;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_340,"--remove-memory","");
  local_320[0] = local_310;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_320,"--remove-unused-names --remove-unused-brs","");
  local_300[0] = local_2f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_300,"--remove-unused-module-elements","");
  local_2e0[0] = local_2d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2e0,"--remove-unused-nonfunction-module-elements","");
  local_2c0[0] = local_2b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c0,"--reorder-functions","");
  local_2a0[0] = local_290;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a0,"--reorder-locals","");
  local_280[0] = local_270;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"--simplify-globals","");
  local_260[0] = local_250;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_260,"--simplify-locals --vacuum","");
  local_240[0] = local_230;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"--strip","");
  plVar5 = local_210;
  local_220[0] = plVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"--vacuum","");
  __l._M_len = 0x22;
  __l._M_array = (iterator)local_640;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_200,__l,(allocator_type *)&local_120);
  lVar10 = -0x440;
  do {
    if (plVar5 != (long *)plVar5[-2]) {
      operator_delete((long *)plVar5[-2],*plVar5 + 1);
    }
    plVar5 = plVar5 + -4;
    lVar10 = lVar10 + 0x20;
  } while (lVar10 != 0);
  pcVar1 = (this->working)._M_dataplus._M_p;
  passes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_1d8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)
             &passes.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,pcVar1,
             pcVar1 + (this->working)._M_string_length);
  __str.field_2._8_8_ =
       wasm::file_size(&passes.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (passes.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)local_1d8) {
    operator_delete(passes.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)(local_1d8._0_8_ + 1))
    ;
  }
  do {
    local_1d8._16_8_ =
         passes.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    if (local_200 ==
        (undefined1  [8])
        passes.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) break;
    local_34 = 0;
    auVar11 = local_200;
    do {
      local_120 = &pass._M_string_length;
      pcVar1 = (((pointer)auVar11)->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_120,pcVar1,pcVar1 + ((pointer)auVar11)->_M_string_length);
      currCommand.field_2._8_8_ = &local_48;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)((long)&currCommand.field_2 + 8),"wasm-opt","");
      wasm::Path::getBinaryenBinaryTool((string *)local_640);
      plVar5 = (long *)std::__cxx11::string::append((char *)local_640);
      local_78 = &currCommand._M_string_length;
      psVar8 = (size_type *)(plVar5 + 2);
      if ((size_type *)*plVar5 == psVar8) {
        currCommand._M_string_length = *psVar8;
        currCommand.field_2._M_allocated_capacity = plVar5[3];
      }
      else {
        currCommand._M_string_length = *psVar8;
        local_78 = (size_type *)*plVar5;
      }
      currCommand._M_dataplus._M_p = (pointer)plVar5[1];
      *plVar5 = (long)psVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if ((undefined1 *)local_640._0_8_ != local_640 + 0x10) {
        operator_delete((void *)local_640._0_8_,local_640._16_8_ + 1);
      }
      if ((long *)currCommand.field_2._8_8_ != &local_48) {
        operator_delete((void *)currCommand.field_2._8_8_,local_48 + 1);
      }
      local_a0 = &__str._M_string_length;
      pcVar1 = (this->working)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a0,pcVar1,pcVar1 + (this->working)._M_string_length);
      std::__cxx11::string::append((char *)&local_a0);
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_a0,(ulong)(this->test)._M_dataplus._M_p);
      local_c0 = &local_b0;
      plVar9 = plVar5 + 2;
      if ((long *)*plVar5 == plVar9) {
        local_b0 = *plVar9;
        lStack_a8 = plVar5[3];
      }
      else {
        local_b0 = *plVar9;
        local_c0 = (long *)*plVar5;
      }
      local_b8 = plVar5[1];
      *plVar5 = (long)plVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_c0);
      local_e0 = &local_d0;
      plVar9 = plVar5 + 2;
      if ((long *)*plVar5 == plVar9) {
        local_d0 = *plVar9;
        lStack_c8 = plVar5[3];
      }
      else {
        local_d0 = *plVar9;
        local_e0 = (long *)*plVar5;
      }
      local_d8 = plVar5[1];
      *plVar5 = (long)plVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_e0,(ulong)local_120);
      pass.field_2._8_8_ = &local_f0;
      plVar9 = plVar5 + 2;
      if ((long *)*plVar5 == plVar9) {
        local_f0 = *plVar9;
        lStack_e8 = plVar5[3];
      }
      else {
        local_f0 = *plVar9;
        pass.field_2._8_8_ = (long *)*plVar5;
      }
      *plVar5 = (long)plVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append(pass.field_2._M_local_buf + 8);
      currCommand.field_2._8_8_ = &local_48;
      plVar9 = plVar5 + 2;
      if ((long *)*plVar5 == plVar9) {
        local_48 = *plVar9;
        lStack_40 = plVar5[3];
      }
      else {
        local_48 = *plVar9;
        currCommand.field_2._8_8_ = (long *)*plVar5;
      }
      *plVar5 = (long)plVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 (currCommand.field_2._M_local_buf + 8,
                                  (ulong)extraFlags_abi_cxx11_._M_dataplus._M_p);
      local_640._0_8_ = local_640 + 0x10;
      psVar8 = (size_type *)(plVar5 + 2);
      if ((size_type *)*plVar5 == psVar8) {
        local_640._16_8_ = *psVar8;
        auStack_628._0_8_ = plVar5[3];
      }
      else {
        local_640._16_8_ = *psVar8;
        local_640._0_8_ = (size_type *)*plVar5;
      }
      local_640._8_8_ = plVar5[1];
      *plVar5 = (long)psVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_78,local_640._0_8_);
      if ((undefined1 *)local_640._0_8_ != local_640 + 0x10) {
        operator_delete((void *)local_640._0_8_,local_640._16_8_ + 1);
      }
      if ((long *)currCommand.field_2._8_8_ != &local_48) {
        operator_delete((void *)currCommand.field_2._8_8_,local_48 + 1);
      }
      if ((long *)pass.field_2._8_8_ != &local_f0) {
        operator_delete((void *)pass.field_2._8_8_,local_f0 + 1);
      }
      if (local_e0 != &local_d0) {
        operator_delete(local_e0,local_d0 + 1);
      }
      if (local_c0 != &local_b0) {
        operator_delete(local_c0,local_b0 + 1);
      }
      if (local_a0 != &__str._M_string_length) {
        operator_delete(local_a0,__str._M_string_length + 1);
      }
      if (this->binary == false) {
        std::__cxx11::string::append((char *)&local_78);
      }
      if (this->verbose == true) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"|    trying pass command: ",0x1a);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(char *)local_78,
                            (long)currCommand._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      }
      local_1d8._24_8_ = &local_1b0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_1d8 + 0x18),local_78,currCommand._M_dataplus._M_p + (long)local_78
                );
      ProgramResult::ProgramResult((ProgramResult *)local_640,(string *)(local_1d8 + 0x18));
      uVar2 = local_640._0_4_;
      if ((undefined1 *)local_640._8_8_ != auStack_628) {
        operator_delete((void *)local_640._8_8_,auStack_628._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._24_8_ != &local_1b0) {
        operator_delete((void *)local_1d8._24_8_,local_1b0._M_allocated_capacity + 1);
      }
      uVar3 = __str.field_2._8_8_;
      if (uVar2 == 0) {
        local_160[0] = local_150;
        pcVar1 = (this->test)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_160,pcVar1,pcVar1 + (this->test)._M_string_length);
        uVar7 = wasm::file_size(local_160);
        if (local_160[0] != local_150) {
          operator_delete(local_160[0],local_150[0] + 1);
        }
        uVar3 = __str.field_2._8_8_;
        if (uVar7 < (ulong)__str.field_2._8_8_) {
          local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
          pcVar1 = (this->command)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1a0,pcVar1,pcVar1 + (this->command)._M_string_length);
          ProgramResult::ProgramResult((ProgramResult *)local_640,&local_1a0);
          bVar4 = ProgramResult::operator==((ProgramResult *)local_640,&expected);
          if ((undefined1 *)local_640._8_8_ != auStack_628) {
            operator_delete((void *)local_640._8_8_,auStack_628._0_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
            operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
          }
          uVar3 = __str.field_2._8_8_;
          if (bVar4) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"|    command \"",0xe);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,(char *)local_78,
                                (long)currCommand._M_dataplus._M_p);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar6,"\" succeeded, reduced size to ",0x1d);
            poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
            local_640[0] = 10;
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_640,1);
            local_140[0] = local_130;
            pcVar1 = (this->test)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_140,pcVar1,pcVar1 + (this->test)._M_string_length);
            local_180[0] = local_170;
            pcVar1 = (this->working)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_180,pcVar1,pcVar1 + (this->working)._M_string_length);
            wasm::copy_file(local_140,(string *)local_180);
            plVar5 = local_170;
            if (local_180[0] != plVar5) {
              operator_delete(local_180[0],local_170[0] + 1);
              plVar5 = extraout_RAX;
            }
            local_34 = (uint)CONCAT71((int7)((ulong)plVar5 >> 8),1);
            uVar3 = uVar7;
            if (local_140[0] != local_130) {
              operator_delete(local_140[0],local_130[0] + 1);
            }
          }
        }
      }
      __str.field_2._8_8_ = uVar3;
      if (local_78 != &currCommand._M_string_length) {
        operator_delete(local_78,currCommand._M_string_length + 1);
      }
      if (local_120 != &pass._M_string_length) {
        operator_delete(local_120,pass._M_string_length + 1);
      }
      auVar11 = (undefined1  [8])((long)auVar11 + 0x20);
    } while (auVar11 != (undefined1  [8])local_1d8._16_8_);
  } while ((local_34 & 1) != 0);
  if (this->verbose == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"|    done with passes for now\n",0x1e);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_200);
  return;
}

Assistant:

void reduceUsingPasses() {
    // run optimization passes until we can't shrink it any more
    std::vector<std::string> passes = {
      "-Oz",
      "-Os",
      "-O1",
      "-O2",
      "-O3",
      "-O4",
      "--flatten -Os",
      "--flatten -O3",
      "--flatten --simplify-locals-notee-nostructure --local-cse -Os",
      "--coalesce-locals --vacuum",
      "--dae",
      "--dae-optimizing",
      "--dce",
      "--duplicate-function-elimination",
      "--gto",
      "--inlining",
      "--inlining-optimizing",
      "--optimize-level=3 --inlining-optimizing",
      "--local-cse",
      "--memory-packing",
      "--remove-unused-names --merge-blocks --vacuum",
      "--optimize-instructions",
      "--precompute",
      "--remove-imports",
      "--remove-memory",
      "--remove-unused-names --remove-unused-brs",
      "--remove-unused-module-elements",
      "--remove-unused-nonfunction-module-elements",
      "--reorder-functions",
      "--reorder-locals",
      // TODO: signature* passes
      "--simplify-globals",
      "--simplify-locals --vacuum",
      "--strip",
      "--vacuum"};
    auto oldSize = file_size(working);
    bool more = true;
    while (more) {
      // std::cerr << "|    starting passes loop iteration\n";
      more = false;
      // try both combining with a generic shrink (so minor pass overhead is
      // compensated for), and without
      for (auto pass : passes) {
        std::string currCommand = Path::getBinaryenBinaryTool("wasm-opt") + " ";
        currCommand += working + " -o " + test + " " + pass + " " + extraFlags;
        if (!binary) {
          currCommand += " -S ";
        }
        if (verbose) {
          std::cerr << "|    trying pass command: " << currCommand << "\n";
        }
        if (!ProgramResult(currCommand).failed()) {
          auto newSize = file_size(test);
          if (newSize < oldSize) {
            // the pass didn't fail, and the size looks smaller, so promising
            // see if it is still has the property we are preserving
            if (ProgramResult(command) == expected) {
              std::cerr << "|    command \"" << currCommand
                        << "\" succeeded, reduced size to " << newSize << '\n';
              copy_file(test, working);
              more = true;
              oldSize = newSize;
            }
          }
        }
      }
    }
    if (verbose) {
      std::cerr << "|    done with passes for now\n";
    }
  }